

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

bool Imf_2_5::usesLongNames(Header *header)

{
  const_iterator cVar1;
  const_iterator cVar2;
  size_t sVar3;
  char *__s;
  ConstIterator CVar4;
  ChannelList *this;
  const_iterator cVar5;
  const_iterator cVar6;
  ConstIterator CVar7;
  bool bVar8;
  
  cVar1._M_node = (_Base_ptr)Header::begin(header);
  cVar2._M_node = (_Base_ptr)Header::end(header);
  bVar8 = cVar1._M_node == cVar2._M_node;
  do {
    if (bVar8) {
LAB_0041cfc4:
      this = Header::channels(header);
      cVar5._M_node = (_Base_ptr)ChannelList::begin(this);
      cVar6._M_node = (_Base_ptr)ChannelList::end(this);
      if (cVar5._M_node == cVar6._M_node) {
        bVar8 = false;
      }
      else {
        do {
          sVar3 = strlen((char *)(cVar5._M_node + 1));
          bVar8 = 0x1f < sVar3;
          if (bVar8) {
            return bVar8;
          }
          cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node);
          CVar7 = ChannelList::end(this);
        } while ((const_iterator)cVar5._M_node != CVar7._i._M_node);
      }
      return bVar8;
    }
    sVar3 = strlen((char *)(cVar1._M_node + 1));
    if (0x1f < sVar3) {
LAB_0041cfbb:
      if (!bVar8) {
        return true;
      }
      goto LAB_0041cfc4;
    }
    __s = (char *)(**(code **)(**(long **)(cVar1._M_node + 9) + 0x10))();
    sVar3 = strlen(__s);
    if (0x1f < sVar3) goto LAB_0041cfbb;
    cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
    CVar4 = Header::end(header);
    bVar8 = (const_iterator)cVar1._M_node == CVar4._i._M_node;
  } while( true );
}

Assistant:

bool
usesLongNames (const Header &header)
{
    //
    // If an OpenEXR file contains any attribute names, attribute type names
    // or channel names longer than 31 characters, then the file cannot be
    // read by older versions of the IlmImf library (up to OpenEXR 1.6.1).
    // Before writing the file header, we check if the header contains
    // any names longer than 31 characters; if it does, then we set the
    // LONG_NAMES_FLAG in the file version number.  Older versions of the
    // IlmImf library will refuse to read files that have the LONG_NAMES_FLAG
    // set.  Without the flag, older versions of the library would mis-
    // interpret the file as broken.
    //

    for (Header::ConstIterator i = header.begin();
         i != header.end();
         ++i)
    {
        if (strlen (i.name()) >= 32 || strlen (i.attribute().typeName()) >= 32)
            return true;
    }

    const ChannelList &channels = header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        if (strlen (i.name()) >= 32)
            return true;
    }

    return false;
}